

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DefaultSupermap.hpp
# Opt level: O3

unique_ptr<supermap::KeyValueStorage<supermap::Key<1UL>,_supermap::ByteArray<1UL>,_unsigned_long>,_std::default_delete<supermap::KeyValueStorage<supermap::Key<1UL>,_supermap::ByteArray<1UL>,_unsigned_long>_>_>
 __thiscall
supermap::DefaultSupermap<supermap::Key<1UL>,_supermap::ByteArray<1UL>,_unsigned_long>::build
          (DefaultSupermap<supermap::Key<1UL>,_supermap::ByteArray<1UL>,_unsigned_long> *this,
          unique_ptr<supermap::ExtractibleKeyValueStorage<supermap::Key<1UL>,_unsigned_long,_unsigned_long>,_std::default_delete<supermap::ExtractibleKeyValueStorage<supermap::Key<1UL>,_unsigned_long,_unsigned_long>_>_>
          *nested,BuildParameters *params)

{
  function<std::unique_ptr<supermap::FilteringRegister<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_supermap::Key<1UL>_>,_std::default_delete<supermap::FilteringRegister<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_supermap::Key<1UL>_>_>_>_()>
  *this_00;
  Supermap<supermap::Key<1UL>,_supermap::ByteArray<1UL>,_unsigned_long> *this_01;
  function<std::unique_ptr<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>,_supermap::Key<1UL>_>,_std::default_delete<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>,_supermap::Key<1UL>_>_>_>_(supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>,_supermap::Key<1UL>_>_&&)>
  indexSupplier;
  function<std::unique_ptr<supermap::SortedStoragesList<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>,_supermap::Key<1UL>,_supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>,_supermap::Key<1UL>_>_>,_std::default_delete<supermap::SortedStoragesList<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>,_supermap::Key<1UL>,_supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>,_supermap::Key<1UL>_>_>_>_>_()>
  indexListSupplier;
  bool local_129;
  undefined1 local_128 [16];
  _Manager_type local_118;
  code *local_110;
  _Any_data local_108;
  code *local_f8;
  code *local_f0;
  anon_class_40_2_6f9b86c8 local_e8;
  _Any_data local_b8;
  _Any_data local_a0;
  code *local_90;
  _Any_data local_80;
  code *local_70;
  _Any_data local_60;
  code *local_50;
  _Any_data local_40;
  code *local_30;
  
  local_129 = true;
  local_128._0_8_ = (TemporaryFolder *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<supermap::io::TemporaryFolder,std::allocator<supermap::io::TemporaryFolder>,std::__cxx11::string_const&,bool>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_128 + 8),
             (TemporaryFolder **)local_128,(allocator<supermap::io::TemporaryFolder> *)&local_108,
             &params->folderName,&local_129);
  local_108._M_unused._M_object = operator_new(8);
  *(code **)local_108._M_unused._0_8_ = memcmp;
  local_e8.maxRamLoad = 0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<supermap::io::EncapsulatedFileManager,std::allocator<supermap::io::EncapsulatedFileManager>,std::shared_ptr<supermap::io::TemporaryFolder>,std::unique_ptr<supermap::io::DiskFileManager,std::default_delete<supermap::io::DiskFileManager>>>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_e8.registerSupplier,
             (EncapsulatedFileManager **)&local_e8,
             (allocator<supermap::io::EncapsulatedFileManager> *)&local_a0,
             (shared_ptr<supermap::io::TemporaryFolder> *)local_128,
             (unique_ptr<supermap::io::DiskFileManager,_std::default_delete<supermap::io::DiskFileManager>_>
              *)&local_108);
  local_b8._M_unused._M_object = (void *)local_e8.maxRamLoad;
  local_b8._8_8_ = local_e8.registerSupplier.super__Function_base._M_functor._M_unused._M_object;
  local_e8.maxRamLoad = 0;
  local_e8.registerSupplier.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  if ((long *)local_108._M_unused._0_8_ != (long *)0x0) {
    (**(code **)(*local_108._M_unused._M_object + 0x30))();
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_128._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_128._8_8_);
  }
  local_128._0_8_ = (TemporaryFolder *)0x0;
  local_128._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_110 = std::
              _Function_handler<std::unique_ptr<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>,_supermap::Key<1UL>_>,_std::default_delete<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>,_supermap::Key<1UL>_>_>_>_(supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>,_supermap::Key<1UL>_>_&&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Glebanister[P]supermap/src/builder/DefaultSupermap.hpp:58:29)>
              ::_M_invoke;
  local_118 = std::
              _Function_handler<std::unique_ptr<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>,_supermap::Key<1UL>_>,_std::default_delete<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>,_supermap::Key<1UL>_>_>_>_(supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>,_supermap::Key<1UL>_>_&&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Glebanister[P]supermap/src/builder/DefaultSupermap.hpp:58:29)>
              ::_M_manager;
  local_108._M_unused._0_8_ = (undefined8)params->errorProbability;
  local_108._8_8_ = 0;
  local_f0 = std::
             _Function_handler<std::unique_ptr<supermap::FilteringRegister<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_supermap::Key<1UL>_>,_std::default_delete<supermap::FilteringRegister<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_supermap::Key<1UL>_>_>_>_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Glebanister[P]supermap/src/builder/DefaultSupermap.hpp:63:37)>
             ::_M_invoke;
  local_f8 = std::
             _Function_handler<std::unique_ptr<supermap::FilteringRegister<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_supermap::Key<1UL>_>,_std::default_delete<supermap::FilteringRegister<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_supermap::Key<1UL>_>_>_>_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Glebanister[P]supermap/src/builder/DefaultSupermap.hpp:63:37)>
             ::_M_manager;
  local_e8.maxRamLoad = params->batchSize;
  this_00 = &local_e8.registerSupplier;
  std::
  function<std::unique_ptr<supermap::FilteringRegister<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_supermap::Key<1UL>_>,_std::default_delete<supermap::FilteringRegister<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_supermap::Key<1UL>_>_>_>_()>
  ::function(this_00,(function<std::unique_ptr<supermap::FilteringRegister<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_supermap::Key<1UL>_>,_std::default_delete<supermap::FilteringRegister<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_supermap::Key<1UL>_>_>_>_()>
                      *)&local_108);
  std::
  function<std::unique_ptr<supermap::SortedStoragesList<supermap::KeyValue<supermap::Key<1ul>,unsigned_long>,unsigned_long,std::shared_ptr<supermap::Filter<supermap::Key<1ul>>>,supermap::Key<1ul>,supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1ul>,unsigned_long>,unsigned_long,std::shared_ptr<supermap::Filter<supermap::Key<1ul>>>,supermap::Key<1ul>>>,std::default_delete<supermap::SortedStoragesList<supermap::KeyValue<supermap::Key<1ul>,unsigned_long>,unsigned_long,std::shared_ptr<supermap::Filter<supermap::Key<1ul>>>,supermap::Key<1ul>,supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1ul>,unsigned_long>,unsigned_long,std::shared_ptr<supermap::Filter<supermap::Key<1ul>>>,supermap::Key<1ul>>>>>()>
  ::
  function<supermap::DefaultSupermap<supermap::Key<1ul>,supermap::ByteArray<1ul>,unsigned_long>::build(std::unique_ptr<supermap::ExtractibleKeyValueStorage<supermap::Key<1ul>,unsigned_long,unsigned_long>,std::default_delete<supermap::ExtractibleKeyValueStorage<supermap::Key<1ul>,unsigned_long,unsigned_long>>>&&,supermap::DefaultSupermap<supermap::Key<1ul>,supermap::ByteArray<1ul>,unsigned_long>::BuildParameters_const&)::_lambda()_2_,void>
            ((function<std::unique_ptr<supermap::SortedStoragesList<supermap::KeyValue<supermap::Key<1ul>,unsigned_long>,unsigned_long,std::shared_ptr<supermap::Filter<supermap::Key<1ul>>>,supermap::Key<1ul>,supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1ul>,unsigned_long>,unsigned_long,std::shared_ptr<supermap::Filter<supermap::Key<1ul>>>,supermap::Key<1ul>>>,std::default_delete<supermap::SortedStoragesList<supermap::KeyValue<supermap::Key<1ul>,unsigned_long>,unsigned_long,std::shared_ptr<supermap::Filter<supermap::Key<1ul>>>,supermap::Key<1ul>,supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1ul>,unsigned_long>,unsigned_long,std::shared_ptr<supermap::Filter<supermap::Key<1ul>>>,supermap::Key<1ul>>>>>()>
              *)local_a0._M_pod_data,&local_e8);
  if (local_e8.registerSupplier.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_e8.registerSupplier.super__Function_base._M_manager)
              ((_Any_data *)this_00,(_Any_data *)this_00,__destroy_functor);
  }
  this_01 = (Supermap<supermap::Key<1UL>,_supermap::ByteArray<1UL>,_unsigned_long> *)
            operator_new(0x1438);
  std::
  make_unique<supermap::KeyValueShrinkableStorage<supermap::Key<1ul>,supermap::ByteArray<1ul>,unsigned_long,std::shared_ptr<supermap::Filter<supermap::Key<1ul>>>>,char_const(&)[19],char_const(&)[15],std::shared_ptr<supermap::io::FileManager>&,std::function<std::unique_ptr<supermap::FilteringRegister<supermap::KeyValue<supermap::Key<1ul>,unsigned_long>,supermap::Key<1ul>>,std::default_delete<supermap::FilteringRegister<supermap::KeyValue<supermap::Key<1ul>,unsigned_long>,supermap::Key<1ul>>>>()>&>
            ((char (*) [19])&local_e8,(char (*) [15])"storage-not-sorted",
             (shared_ptr<supermap::io::FileManager> *)"storage-sorted",
             (function<std::unique_ptr<supermap::FilteringRegister<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_supermap::Key<1UL>_>,_std::default_delete<supermap::FilteringRegister<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_supermap::Key<1UL>_>_>_>_()>
              *)&local_b8);
  std::
  function<std::unique_ptr<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>,_supermap::Key<1UL>_>,_std::default_delete<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>,_supermap::Key<1UL>_>_>_>_(supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>,_supermap::Key<1UL>_>_&&)>
  ::function((function<std::unique_ptr<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>,_supermap::Key<1UL>_>,_std::default_delete<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>,_supermap::Key<1UL>_>_>_>_(supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>,_supermap::Key<1UL>_>_&&)>
              *)&local_40,
             (function<std::unique_ptr<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>,_supermap::Key<1UL>_>,_std::default_delete<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>,_supermap::Key<1UL>_>_>_>_(supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>,_supermap::Key<1UL>_>_&&)>
              *)local_128);
  std::
  function<std::unique_ptr<supermap::SortedStoragesList<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>,_supermap::Key<1UL>,_supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>,_supermap::Key<1UL>_>_>,_std::default_delete<supermap::SortedStoragesList<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>,_supermap::Key<1UL>,_supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>,_supermap::Key<1UL>_>_>_>_>_()>
  ::function((function<std::unique_ptr<supermap::SortedStoragesList<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>,_supermap::Key<1UL>,_supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>,_supermap::Key<1UL>_>_>,_std::default_delete<supermap::SortedStoragesList<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>,_supermap::Key<1UL>,_supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>,_supermap::Key<1UL>_>_>_>_>_()>
              *)&local_60,
             (function<std::unique_ptr<supermap::SortedStoragesList<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>,_supermap::Key<1UL>,_supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>,_supermap::Key<1UL>_>_>,_std::default_delete<supermap::SortedStoragesList<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>,_supermap::Key<1UL>,_supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>,_supermap::Key<1UL>_>_>_>_>_()>
              *)&local_a0);
  std::
  function<std::unique_ptr<supermap::FilteringRegister<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_supermap::Key<1UL>_>,_std::default_delete<supermap::FilteringRegister<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_supermap::Key<1UL>_>_>_>_()>
  ::function((function<std::unique_ptr<supermap::FilteringRegister<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_supermap::Key<1UL>_>,_std::default_delete<supermap::FilteringRegister<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_supermap::Key<1UL>_>_>_>_()>
              *)&local_80,
             (function<std::unique_ptr<supermap::FilteringRegister<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_supermap::Key<1UL>_>,_std::default_delete<supermap::FilteringRegister<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_supermap::Key<1UL>_>_>_>_()>
              *)&local_108);
  Supermap<supermap::Key<1UL>,_supermap::ByteArray<1UL>,_unsigned_long>::Supermap
            (this_01,nested,
             (unique_ptr<supermap::KeyValueShrinkableStorage<supermap::Key<1UL>,_supermap::ByteArray<1UL>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>_>,_std::default_delete<supermap::KeyValueShrinkableStorage<supermap::Key<1UL>,_supermap::ByteArray<1UL>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>_>_>_>
              *)&local_e8,
             (function<std::unique_ptr<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>,_supermap::Key<1UL>_>,_std::default_delete<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>,_supermap::Key<1UL>_>_>_>_(supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>,_supermap::Key<1UL>_>_&&)>
              *)&local_40,
             (function<std::unique_ptr<supermap::SortedStoragesList<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>,_supermap::Key<1UL>,_supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>,_supermap::Key<1UL>_>_>,_std::default_delete<supermap::SortedStoragesList<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>,_supermap::Key<1UL>,_supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>,_supermap::Key<1UL>_>_>_>_>_()>
              *)&local_60,
             (function<std::unique_ptr<supermap::FilteringRegister<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_supermap::Key<1UL>_>,_std::default_delete<supermap::FilteringRegister<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_supermap::Key<1UL>_>_>_>_()>
              *)&local_80,params->batchSize,params->maxNotSortedPart);
  *(Supermap<supermap::Key<1UL>,_supermap::ByteArray<1UL>,_unsigned_long> **)this = this_01;
  if (local_70 != (code *)0x0) {
    (*local_70)(&local_80,&local_80,__destroy_functor);
  }
  if (local_50 != (code *)0x0) {
    (*local_50)(&local_60,&local_60,__destroy_functor);
  }
  if (local_30 != (code *)0x0) {
    (*local_30)(&local_40,&local_40,__destroy_functor);
  }
  if ((long *)local_e8.maxRamLoad != (long *)0x0) {
    (**(code **)(*(long *)local_e8.maxRamLoad + 0x18))();
  }
  if (local_90 != (code *)0x0) {
    (*local_90)(&local_a0,&local_a0,__destroy_functor);
  }
  if (local_f8 != (code *)0x0) {
    (*local_f8)(&local_108,&local_108,__destroy_functor);
  }
  if (local_118 != (_Manager_type)0x0) {
    (*local_118)((_Any_data *)local_128,(_Any_data *)local_128,__destroy_functor);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_);
  }
  return (__uniq_ptr_data<supermap::KeyValueStorage<supermap::Key<1UL>,_supermap::ByteArray<1UL>,_unsigned_long>,_std::default_delete<supermap::KeyValueStorage<supermap::Key<1UL>,_supermap::ByteArray<1UL>,_unsigned_long>_>,_true,_true>
          )(__uniq_ptr_data<supermap::KeyValueStorage<supermap::Key<1UL>,_supermap::ByteArray<1UL>,_unsigned_long>,_std::default_delete<supermap::KeyValueStorage<supermap::Key<1UL>,_supermap::ByteArray<1UL>,_unsigned_long>_>,_true,_true>
            )this;
}

Assistant:

static std::unique_ptr<KVS> build(
        std::unique_ptr<RamStorageBase> &&nested,
        const BuildParameters &params
    ) {
        std::shared_ptr<supermap::io::FileManager> fileManager
            = std::make_shared<supermap::io::EncapsulatedFileManager>(
                std::make_shared<supermap::io::TemporaryFolder>(params.folderName, true),
                std::make_unique<supermap::io::DiskFileManager>()
            );

        std::function<std::unique_ptr<IndexStorageBase>(IndexStorageBase &&)>
            indexSupplier = [](IndexStorageBase &&sortedStorage) {
            return std::make_unique<FilteredIndexStorage>(std::move(sortedStorage));
        };

        std::function<std::unique_ptr<Register>()>
            innerRegisterSupplier = [errorProbability = params.errorProbability]() {
            return std::make_unique<FilteringRegister<KI, K>>(
                [errorProbability = errorProbability]() {
                    return std::make_unique<BloomFilter<K>>(
                        errorProbability,
                        std::make_unique<XXHasher>()
                    );
                },
                [](const KI &ki) { return ki.key; }
            );
        };

        std::function<std::unique_ptr<IndexStorageListBase>()>
            indexListSupplier = [maxRamLoad = params.batchSize, registerSupplier = innerRegisterSupplier]() {
            return std::make_unique<DefaultBinaryCollapsingList>(
                maxRamLoad,
                registerSupplier
            );
        };

        return std::unique_ptr<KVS>(
            new Smap(
                std::move(nested),
                std::make_unique<DiskStorage>(
                    "storage-not-sorted",
                    "storage-sorted",
                    fileManager,
                    innerRegisterSupplier
                ),
                indexSupplier,
                indexListSupplier,
                innerRegisterSupplier,
                params.batchSize,
                params.maxNotSortedPart
            )
        );
    }